

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.hpp
# Opt level: O1

void __thiscall
duckdb::SelectionVector::SelectionVector(SelectionVector *this,idx_t start,idx_t count)

{
  sel_t *psVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  sel_t sVar4;
  idx_t count_00;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  (this->selection_data).internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
  count_00 = 0x800;
  if (0x800 < count) {
    count_00 = count;
  }
  Initialize(this,count_00);
  auVar2 = _DAT_01defe80;
  if (count != 0) {
    psVar1 = this->sel_vector;
    lVar5 = count - 1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar3 = 0;
    auVar6 = auVar6 ^ _DAT_01defe80;
    auVar7 = _DAT_01df8070;
    do {
      auVar8 = auVar7 ^ auVar2;
      sVar4 = (sel_t)start;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        psVar1[uVar3] = sVar4;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        psVar1[uVar3 + 1] = sVar4 + 1;
      }
      uVar3 = uVar3 + 2;
      lVar5 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar5 + 2;
      start = (idx_t)(sVar4 + 2);
    } while ((count + 1 & 0xfffffffffffffffe) != uVar3);
  }
  return;
}

Assistant:

SelectionVector(idx_t start, idx_t count) {
		Initialize(MaxValue<idx_t>(count, STANDARD_VECTOR_SIZE));
		for (idx_t i = 0; i < count; i++) {
			set_index(i, start + i);
		}
	}